

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_instance_exports(wasm_instance_t *instance,wasm_extern_vec_t *out)

{
  pointer pRVar1;
  Instance *pIVar2;
  wasm_extern_t *this;
  size_t i;
  ulong uVar3;
  RefPtr<wabt::interp::Extern> local_48;
  
  pIVar2 = wasm_ref_t::As<wabt::interp::Instance>(&instance->super_wasm_ref_t);
  wasm_extern_vec_new_uninitialized
            (out,(long)(pIVar2->exports_).
                       super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar2->exports_).
                       super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  fprintf(_stderr,"CAPI: [%s] %zx\n","wasm_instance_exports",
          (long)(pIVar2->exports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pIVar2->exports_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start >> 3);
  for (uVar3 = 0;
      pRVar1 = (pIVar2->exports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(pIVar2->exports_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this = (wasm_extern_t *)operator_new(0x18);
    wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
              (&local_48,(instance->super_wasm_ref_t).I.store_,(Ref)pRVar1[uVar3].index);
    wasm_extern_t::wasm_extern_t(this,&local_48);
    out->data[uVar3] = this;
    wabt::interp::RefPtr<wabt::interp::Extern>::reset(&local_48);
  }
  return;
}

Assistant:

void wasm_instance_exports(const wasm_instance_t* instance,
                           own wasm_extern_vec_t* out) {
  auto&& exports = instance->As<Instance>()->exports();
  wasm_extern_vec_new_uninitialized(out, exports.size());
  TRACE("%" PRIzx, exports.size());

  for (size_t i = 0; i < exports.size(); ++i) {
    out->data[i] =
        new wasm_extern_t{instance->I.store()->UnsafeGet<Extern>(exports[i])};
  }
}